

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetEtaParams(void *kinmem,sunrealtype egamma,sunrealtype ealpha)

{
  KINMem in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x204,"KINSetEtaParams",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (((1.0 < in_XMM1_Qa) && (in_XMM1_Qa <= 2.0)) ||
          ((in_XMM1_Qa == 0.0 && (!NAN(in_XMM1_Qa))))) {
    if ((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) {
      in_RDI->kin_eta_alpha = in_XMM1_Qa;
    }
    else {
      in_RDI->kin_eta_alpha = 2.0;
    }
    if (((0.0 < in_XMM0_Qa) && (in_XMM0_Qa <= 1.0)) || ((in_XMM0_Qa == 0.0 && (!NAN(in_XMM0_Qa)))))
    {
      if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
        in_RDI->kin_eta_gamma = in_XMM0_Qa;
      }
      else {
        in_RDI->kin_eta_gamma = 0.9;
      }
      local_4 = 0;
    }
    else {
      KINProcessError(in_RDI,-2,0x21b,"KINSetEtaParams",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                      ,"gamma out of range.");
      local_4 = -2;
    }
  }
  else {
    KINProcessError(in_RDI,-2,0x20e,"KINSetEtaParams",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"alpha out of range.");
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int KINSetEtaParams(void* kinmem, sunrealtype egamma, sunrealtype ealpha)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if ((ealpha <= ONE) || (ealpha > TWO))
  {
    if (ealpha != ZERO)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_ALPHA);
      return (KIN_ILL_INPUT);
    }
  }

  if (ealpha == ZERO) { kin_mem->kin_eta_alpha = TWO; }
  else { kin_mem->kin_eta_alpha = ealpha; }

  if ((egamma <= ZERO) || (egamma > ONE))
  {
    if (egamma != ZERO)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_GAMMA);
      return (KIN_ILL_INPUT);
    }
  }

  if (egamma == ZERO) { kin_mem->kin_eta_gamma = POINT9; }
  else { kin_mem->kin_eta_gamma = egamma; }

  return (KIN_SUCCESS);
}